

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::SetNumElConnected(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                    *this,TPZVec<int> *numelconnected)

{
  TPZVec<int> *in_RSI;
  TPZVec<int> *in_RDI;
  int64_t in_stack_00000008;
  TPZVec<int> *in_stack_00000010;
  
  TPZVec<int>::NElements(in_RSI);
  TPZVec<int>::Resize(in_stack_00000010,in_stack_00000008);
  TPZVec<int>::operator=(in_RSI,in_RDI);
  TPZVec<int>::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SetNumElConnected(TPZVec < int > &numelconnected){
	fNumElConnected.Resize(numelconnected.NElements());
	fNumElConnected=numelconnected;
	fNumElConnectedBackup = fNumElConnected;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "fNumElConnected " << fNumElConnected;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}